

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapePiram>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int scalarorder;
  TPZManVector<int,_27> scalarOrders;
  TPZManVector<int,_27> local_b8;
  
  TPZManVector<long,_8>::TPZManVector((TPZManVector<long,_8> *)&scalarOrders,ids);
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<int,_20>::TPZManVector((TPZManVector<int,_20> *)&scalarOrders,sideorient);
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)&scalarOrders);
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)&scalarOrders);
  scalarorder = connectorders->fStore[5] + 1;
  TPZManVector<int,_27>::TPZManVector(&scalarOrders,0xe,&scalarorder);
  TPZShapeH1<pzshape::TPZShapePiram>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&scalarOrders.super_TPZVec<int>,data);
  if (connectorders->fNElements != 6) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x26);
  }
  TPZManVector<int,_27>::TPZManVector(&local_b8,connectorders);
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_b8);
  TPZManVector<int,_27>::~TPZManVector(&local_b8);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,6);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x1c5);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}